

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t read_body_to_string(archive_read *a,tar *tar,archive_string *as,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  ulong size;
  ulong uVar2;
  ulong request;
  
  size = tar_atol((char *)((long)&as[5].s + 4),0xc);
  wVar1 = L'\xffffffe2';
  if ((long)size < 0x1000000000000000) {
    if (size < 0x100001) {
      wVar1 = read_bytes_to_string(a,&tar->entry_pathname,size,(size_t *)h);
      *(ulong *)h = *h + (ulong)(-(int)size & 0x1ff);
    }
    else {
      (tar->entry_pathname).length = 0;
      request = size + 0x1ff & 0xfffffffffffffe00;
      uVar2 = __archive_read_consume(a,request);
      if (request == uVar2) {
        archive_set_error(&a->archive,0x16,"Special header too large: %d > 1MiB",size & 0xffffffff);
        wVar1 = L'\xffffffec';
      }
    }
  }
  return wVar1;
}

Assistant:

static int
read_body_to_string(struct archive_read *a, struct tar *tar,
    struct archive_string *as, const void *h, size_t *unconsumed)
{
	int64_t size;
	const struct archive_entry_header_ustar *header;
	int r;

	(void)tar; /* UNUSED */
	header = (const struct archive_entry_header_ustar *)h;
	size  = tar_atol(header->size, sizeof(header->size));
	if (size > entry_limit) {
		return (ARCHIVE_FATAL);
	}
	if ((size > (int64_t)pathname_limit) || (size < 0)) {
		archive_string_empty(as);
		int64_t to_consume = ((size + 511) & ~511);
		if (to_consume != __archive_read_consume(a, to_consume)) {
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, EINVAL,
		    "Special header too large: %d > 1MiB",
		    (int)size);
		return (ARCHIVE_WARN);
	}
	r = read_bytes_to_string(a, as, size, unconsumed);
	*unconsumed += 0x1ff & (-size);
	return(r);
}